

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void conditionalBranchStatement(object *proc,int retSize)

{
  item *x_00;
  item *x;
  int L;
  int retSize_local;
  object *proc_local;
  
  x_00 = (item *)calloc(1,0x30);
  if (currentSymbol != 0x12d) {
    mark("missing left paranetheses in if statement");
    exit(-1);
  }
  getSymbol();
  expression(x_00);
  cJump(x_00);
  if (currentSymbol != 0x12e) {
    mark("missing closing right paranetheses of if statement");
    exit(-1);
  }
  getSymbol();
  if (currentSymbol != 0x131) {
    mark("missing left curly bracket");
    exit(-1);
  }
  getSymbol();
  statementSequence(proc,retSize);
  x._0_4_ = 0;
  if (currentSymbol == 0x132) {
    getSymbol();
    while( true ) {
      if (currentSymbol != 0x25c) {
        if (currentSymbol == 0x25b) {
          getSymbol();
          x._0_4_ = fJump((int)x);
          fixLink(x_00->a);
          if (currentSymbol != 0x131) {
            mark("missing left curly bracket in else");
            exit(-1);
          }
          getSymbol();
          statementSequence(proc,retSize);
          if (currentSymbol != 0x132) {
            mark("missing right curly bracket");
            exit(-1);
          }
          getSymbol();
        }
        else {
          fixLink(x_00->a);
        }
        fixLink((int)x);
        return;
      }
      getSymbol();
      if (currentSymbol == 0x12d) {
        getSymbol();
        x._0_4_ = fJump((int)x);
        fixLink(x_00->a);
        expression(x_00);
        cJump(x_00);
        if (currentSymbol != 0x12e) {
          mark("missing closing right paranetheses of if statement");
          exit(-1);
        }
        getSymbol();
      }
      if (currentSymbol != 0x131) break;
      getSymbol();
      statementSequence(proc,retSize);
      if (currentSymbol != 0x132) {
        mark("missing right curly bracket in elseif");
        exit(-1);
      }
      getSymbol();
    }
    mark("missing left curly bracket");
    exit(-1);
  }
  mark("missing right curly bracket");
  exit(-1);
}

Assistant:

procedure 
void conditionalBranchStatement(struct object *proc, int retSize) {
	variable int L;
	variable struct item *x;
	x=NULL; L=0;
	allocMem(x);
	if (currentSymbol == SYMBOL_LPARAN) {
		getSymbol();
		expression(x);
		cJump(x);
		if (currentSymbol == SYMBOL_RPARAN) {
			getSymbol();
		} else {
			mark("missing closing right paranetheses of if statement");
			exit(-1);
		}
	} else {
		mark("missing left paranetheses in if statement");
		exit(-1);
	}
	if (currentSymbol == SYMBOL_CLBRAK) {
		getSymbol(); 
		statementSequence(proc, retSize); L = 0;
		if (currentSymbol == SYMBOL_CRBRAK) {
			getSymbol();
		} else {
			mark("missing right curly bracket");
			exit(-1);
		}
	} else {
		mark("missing left curly bracket");
		exit(-1);
	}
	while (currentSymbol == SYMBOL_ELSIF) {
		getSymbol();
		if (currentSymbol == SYMBOL_LPARAN) {
			getSymbol(); L = fJump(L); fixLink(x->a); expression(x); cJump(x);
			if (currentSymbol == SYMBOL_RPARAN) {
				getSymbol();
			} else {
				mark("missing closing right paranetheses of if statement");
				exit(-1);
			}
		}
		if (currentSymbol == SYMBOL_CLBRAK) {
			getSymbol(); statementSequence(proc, retSize);
			if (currentSymbol == SYMBOL_CRBRAK) {
				getSymbol();
			} else {
				mark("missing right curly bracket in elseif");
					exit(-1);
			}
		} else {
			mark("missing left curly bracket");
			exit(-1);
		}
	}
    if (currentSymbol == SYMBOL_ELSE) {
		getSymbol(); 
		L = fJump(L); 
		fixLink(x->a);
		if (currentSymbol == SYMBOL_CLBRAK) {
			getSymbol(); statementSequence(proc, retSize);
			if (currentSymbol == SYMBOL_CRBRAK) {
				getSymbol();
			} else {
				mark("missing right curly bracket");
				exit(-1);
			}
		} else {
			mark("missing left curly bracket in else");
			exit(-1);
		}
	} else {
		fixLink(x->a);
	}
	fixLink(L);
}